

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O3

size_t anurbs::HilbertCurve<3L>::index_at(size_t m,VectorU *p)

{
  bool bVar1;
  sbyte sVar2;
  size_t sVar3;
  Index j;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong i;
  ulong uVar10;
  size_t sVar11;
  
  if ((long)(m - 1) < 0) {
    sVar11 = 0;
  }
  else {
    sVar11 = 0;
    uVar5 = 0;
    uVar9 = 0;
    uVar10 = m - 1;
    do {
      lVar4 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + ((ulong)(((p->
                                  super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>
                                  ).m_storage.m_data.array[lVar4] >> (uVar10 & 0x3f) & 1) != 0) <<
                        ((byte)lVar4 & 0x3f));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      sVar2 = (sbyte)(uVar9 + 1);
      if (uVar9 + 1 == 3) {
        sVar2 = 0;
      }
      uVar8 = ((uint)((uVar7 ^ uVar5) >> sVar2) | (int)(uVar7 ^ uVar5) << (3U - sVar2 & 0x1f)) & 7;
      uVar6 = uVar8 >> 2 ^ uVar8 >> 1;
      i = (ulong)(uVar6 ^ uVar8);
      uVar7 = 0;
      if (uVar6 != uVar8) {
        uVar7 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
      }
      uVar5 = uVar5 ^ ((uint)(uVar7 >> (3U - sVar2 & 0x3f)) | (uint)(uVar7 << sVar2)) & 7;
      sVar3 = d(i);
      uVar9 = (uVar9 + sVar3 + 1) % 3;
      sVar11 = sVar11 * 8 + i;
      bVar1 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar1);
  }
  return sVar11;
}

Assistant:

static size_t index_at(const size_t m, const VectorU p) noexcept
    {
        // FIXME: check m

        size_t h = 0;
        size_t ve = 0;
        size_t vd = 0;

        for (Index i = m - 1; i > -1; i--) {
            size_t s = 0;

            for (Index j = 0; j < TDimension; j++) {
                s += bit(p[j], i) << j;
            }

            const size_t l = t(ve, vd, s);
            const size_t w = inverse_gc(l);

            ve = ve ^ (rol(e(w), vd + 1));
            vd = (vd + d(w) + 1) % TDimension;
            h = (h << TDimension) | w;
        }

        return h;
    }